

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CatalogReader.hpp
# Opt level: O0

unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
* __thiscall
CatalogReader::createCourseHeirarchy_abi_cxx11_
          (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
           *__return_storage_ptr__,CatalogReader *this)

{
  bool bVar1;
  ostream *poVar2;
  reference pbVar3;
  CourseComponent *this_00;
  mapped_type *ppCVar4;
  bad_cast *this_01;
  pointer local_550;
  bad_cast *e_1;
  out_of_range *e_2;
  CourseComponent *temp;
  string local_3f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3d0;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  undefined1 local_398 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prereqs;
  Course *courseCast;
  out_of_range *e;
  CourseComponent *course;
  vector<CourseComponent_*,_std::allocator<CourseComponent_*>_> *cList;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> required;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2f8;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_289;
  undefined1 local_288 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>_>
  courses;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240 [32];
  ifstream local_220 [8];
  ifstream fin;
  CatalogReader *this_local;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
  *heirarchy;
  
  std::operator+(local_240,&this->resourcesPath);
  std::ifstream::ifstream(local_220,(string *)local_240,_S_in);
  std::__cxx11::string::~string((string *)local_240);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>_>
                   *)local_288);
  local_289 = 0;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
  ::unordered_map(__return_storage_ptr__);
  if ((this->debugOn & 1U) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&this->beginDebugString);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Reader resourcepath: ");
    poVar2 = std::operator<<(poVar2,(string *)&this->resourcesPath);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  getCoursesFromFile_abi_cxx11_
            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>_>
              *)&__range1,this,local_220);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>_>
  ::operator=((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>_>
               *)local_288,
              (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>_>
               *)&__range1);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>_>
                    *)&__range1);
  (*this->major->_vptr_AbstractMajor[1])(&__begin1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__begin1);
  local_2f8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&local_2f8);
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__begin1);
      if ((this->debugOn & 1U) != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,(string *)&this->endDebugString);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      local_289 = 1;
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>_>
      ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>_>
                        *)local_288);
      std::ifstream::~ifstream(local_220);
      return __return_storage_ptr__;
    }
    pbVar3 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string((string *)&cList,(string *)pbVar3);
    this_00 = (CourseComponent *)operator_new(0x18);
    memset(this_00,0,0x18);
    std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>::vector
              ((vector<CourseComponent_*,_std::allocator<CourseComponent_*>_> *)this_00);
    course = this_00;
    if ((this->debugOn & 1U) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Attempting to add ");
      poVar2 = std::operator<<(poVar2,(string *)&cList);
      poVar2 = std::operator<<(poVar2," to heirarchy");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    ppCVar4 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>_>
              ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>_>
                    *)local_288,(key_type *)&cList);
    e = (out_of_range *)*ppCVar4;
    std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>::push_back
              ((vector<CourseComponent_*,_std::allocator<CourseComponent_*>_> *)course,
               (value_type *)&e);
    if (e == (out_of_range *)0x0) {
      local_550 = (pointer)0x0;
    }
    else {
      local_550 = (pointer)__dynamic_cast(e,&CourseComponent::typeinfo,&Course::typeinfo,0);
    }
    prereqs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_550;
    if (local_550 == (pointer)0x0) break;
    Course::getCourseRequisites_abi_cxx11_((Course *)&__range3);
    getPrereqs((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_398,this,(string *)&__range3);
    std::__cxx11::string::~string((string *)&__range3);
    __end3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_398);
    local_3d0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_398);
    while (bVar1 = __gnu_cxx::operator!=(&__end3,&local_3d0), bVar1) {
      pbVar3 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end3);
      std::__cxx11::string::string(local_3f0,(string *)pbVar3);
      if ((this->debugOn & 1U) != 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Adding ");
        poVar2 = std::operator<<(poVar2,local_3f0);
        poVar2 = std::operator<<(poVar2," to prereqs of ");
        (**(code **)(*(long *)prereqs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 0x18))(&temp);
        poVar2 = std::operator<<(poVar2,(string *)&temp);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&temp);
      }
      ppCVar4 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>_>
                ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CourseComponent_*>_>_>
                      *)local_288,(key_type *)local_3f0);
      e_2 = (out_of_range *)*ppCVar4;
      std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>::push_back
                ((vector<CourseComponent_*,_std::allocator<CourseComponent_*>_> *)course,
                 (value_type *)&e_2);
      std::__cxx11::string::~string(local_3f0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end3);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_398);
    std::
    unordered_map<std::__cxx11::string,std::vector<CourseComponent*,std::allocator<CourseComponent*>>*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<CourseComponent*,std::allocator<CourseComponent*>>*>>>
    ::
    emplace<std::__cxx11::string&,std::vector<CourseComponent*,std::allocator<CourseComponent*>>*&>
              ((unordered_map<std::__cxx11::string,std::vector<CourseComponent*,std::allocator<CourseComponent*>>*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<CourseComponent*,std::allocator<CourseComponent*>>*>>>
                *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cList,
               (vector<CourseComponent_*,_std::allocator<CourseComponent_*>_> **)&course);
    std::__cxx11::string::~string((string *)&cList);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  this_01 = (bad_cast *)__cxa_allocate_exception(8);
  std::bad_cast::bad_cast(this_01);
  __cxa_throw(this_01,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

unordered_map<string, vector<CourseComponent*>*> createCourseHeirarchy() const {
			ifstream fin(resourcesPath + resourceExtension);
			unordered_map<string, CourseComponent*> courses;
			unordered_map<string, vector<CourseComponent*>*> heirarchy;
			
			if (debugOn) {
				cout << beginDebugString << endl;
				cout << "Reader resourcepath: " << resourcesPath << endl;
			}
			
			courses = getCoursesFromFile(fin);

			for (auto required : major->getRequiredCourses()) {
				vector<CourseComponent*>* cList = new vector<CourseComponent*>();
				if (debugOn) {
					cout << "Attempting to add " << required << " to heirarchy" << endl;
				}
				CourseComponent* course;
				try { // if course cannot be found initially, just make it a prereq
					course = courses.at(required);
				} catch (out_of_range& e) {
					course = new Prerequisite(required, 4, "");
				}
				// push it to the list

				cList->push_back(course);
				try {
					// attempt to cast it to course to see if it has prerequisites;
					Course* courseCast = dynamic_cast<Course*>(course);
					if (courseCast == nullptr) {
						throw bad_cast(); // throw bad cast to get caught so that it can be a prereq type
					}

					// if it passed, get the prereqs in a vector
					vector<string> prereqs = getPrereqs(courseCast->getCourseRequisites());
					// loop through them and see if we can find them in the courses;
					for (auto name : prereqs) {
						if (debugOn) {
							cout << "Adding " << name << " to prereqs of " << courseCast->getCourseName() << endl;
						}
						CourseComponent* temp;
						try {
							temp = courses.at(name); // check if it exists;
						}
						catch (out_of_range& e) {
							// if it doesnt exist, just say we're unable to retrieve and construct a new one;
							temp = new Course(name, 4, "Unable to Retreive", "Unable to Retreive");
							if (debugOn) {
								cout << temp->getCourseName() << " is being added as a constructed prereq" << endl;
							}
						}
						// push it to the cList;
						cList->push_back(temp);
					}
				} catch (bad_cast& e) {
					if (debugOn) {
						cout << "NOT A COURSE, SIMPLY ADDING AS PREREQUISITE" << endl;
					}
				}
				heirarchy.emplace(required, cList);
			}

			if (debugOn) {
				cout << endDebugString << endl;
			}

			return heirarchy;
		}